

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smfdur.cpp
# Opt level: O0

void checkOptions(Options *opts,int argc,char **argv)

{
  Options *pOVar1;
  bool bVar2;
  ostream *poVar3;
  char *command;
  allocator local_2c9;
  string local_2c8 [32];
  undefined1 local_2a8 [40];
  string local_280 [39];
  allocator local_259;
  string local_258 [39];
  allocator local_231;
  string local_230 [39];
  allocator local_209;
  string local_208 [39];
  allocator local_1e1;
  string local_1e0 [39];
  allocator local_1b9;
  string local_1b8 [39];
  allocator local_191;
  string local_190 [39];
  allocator local_169;
  string local_168 [39];
  allocator local_141;
  string local_140 [39];
  allocator local_119;
  string local_118 [39];
  allocator local_f1;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [32];
  char **local_20;
  char **argv_local;
  Options *pOStack_10;
  int argc_local;
  Options *opts_local;
  
  local_20 = argv;
  argv_local._4_4_ = argc;
  pOStack_10 = opts;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"f|filename=b",&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"display filename after duration",&local_79);
  smf::Options::define(opts,(string *)local_40,(string *)local_78);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  pOVar1 = pOStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"m|minute|minutes=b",&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_c8,"also display duration in minutes after seconds display",&local_c9);
  smf::Options::define(pOVar1,(string *)local_a0,(string *)local_c8);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  pOVar1 = pOStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"author=b",&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_118,"author of program",&local_119);
  smf::Options::define(pOVar1,(string *)local_f0,(string *)local_118);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  pOVar1 = pOStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_140,"version=b",&local_141);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_168,"compilation info",&local_169);
  smf::Options::define(pOVar1,(string *)local_140,(string *)local_168);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  pOVar1 = pOStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_190,"example=b",&local_191);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b8,"example usages",&local_1b9);
  smf::Options::define(pOVar1,(string *)local_190,(string *)local_1b8);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  pOVar1 = pOStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e0,"h|help=b",&local_1e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_208,"short description",&local_209);
  smf::Options::define(pOVar1,(string *)local_1e0,(string *)local_208);
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  smf::Options::process(pOStack_10,argv_local._4_4_,local_20,1,0);
  pOVar1 = pOStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_230,"author",&local_231);
  bVar2 = smf::Options::getBoolean(pOVar1,(string *)local_230);
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator((allocator<char> *)&local_231);
  pOVar1 = pOStack_10;
  if (bVar2) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Written by Craig Stuart Sapp, ");
    poVar3 = std::operator<<(poVar3,"craig@ccrma.stanford.edu, 23 February 2016");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    exit(0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_258,"version",&local_259);
  bVar2 = smf::Options::getBoolean(pOVar1,(string *)local_258);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  pOVar1 = pOStack_10;
  if (bVar2) {
    poVar3 = std::operator<<((ostream *)&std::cout,*local_20);
    poVar3 = std::operator<<(poVar3,", version: 23 February 2016");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"compiled: ");
    poVar3 = std::operator<<(poVar3,"Apr 26 2025");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    exit(0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_280,"help",(allocator *)(local_2a8 + 0x27));
  bVar2 = smf::Options::getBoolean(pOVar1,(string *)local_280);
  std::__cxx11::string::~string(local_280);
  std::allocator<char>::~allocator((allocator<char> *)(local_2a8 + 0x27));
  pOVar1 = pOStack_10;
  if (bVar2) {
    smf::Options::getCommand_abi_cxx11_((Options *)local_2a8);
    command = (char *)std::__cxx11::string::c_str();
    usage(command);
    std::__cxx11::string::~string((string *)local_2a8);
    exit(0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c8,"example",&local_2c9);
  bVar2 = smf::Options::getBoolean(pOVar1,(string *)local_2c8);
  std::__cxx11::string::~string(local_2c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
  if (!bVar2) {
    return;
  }
  example();
  exit(0);
}

Assistant:

void checkOptions(Options& opts, int argc, char* argv[]) {
	opts.define("f|filename=b", "display filename after duration");
	opts.define("m|minute|minutes=b", "also display duration in minutes after seconds display");

   opts.define("author=b",  "author of program");
   opts.define("version=b", "compilation info");
   opts.define("example=b", "example usages");
   opts.define("h|help=b",  "short description");
   opts.process(argc, argv);

   // handle basic options:
   if (opts.getBoolean("author")) {
      cout << "Written by Craig Stuart Sapp, "
           << "craig@ccrma.stanford.edu, 23 February 2016" << endl;
      exit(0);
   } else if (opts.getBoolean("version")) {
      cout << argv[0] << ", version: 23 February 2016" << endl;
      cout << "compiled: " << __DATE__ << endl;
      exit(0);
   } else if (opts.getBoolean("help")) {
      usage(opts.getCommand().c_str());
      exit(0);
   } else if (opts.getBoolean("example")) {
      example();
      exit(0);
   }

}